

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QRectF * __thiscall
QGraphicsItemPrivate::effectiveBoundingRect
          (QRectF *__return_storage_ptr__,QGraphicsItemPrivate *this,QRectF *rect)

{
  QGraphicsEffect *this_00;
  QGraphicsItem *this_01;
  long lVar1;
  qreal qVar2;
  qreal qVar3;
  qreal qVar4;
  QRect QVar5;
  QGraphicsView **ppQVar6;
  bool bVar7;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  QRectF local_e8;
  undefined1 local_c8 [16];
  QRectF local_b8;
  QArrayDataPointer<QGraphicsView_*> local_98;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->graphicsEffect;
  if (this_00 != (QGraphicsEffect *)0x0 && this->scene != (QGraphicsScene *)0x0) {
    this_01 = this->q_ptr;
    bVar7 = QGraphicsEffect::isEnabled(this_00);
    QVar5.x2.m_i = local_c8._8_4_;
    QVar5.y2.m_i = local_c8._12_4_;
    QVar5.x1.m_i = local_c8._0_4_;
    QVar5.y1.m_i = local_c8._4_4_;
    if (bVar7) {
      if (*(long *)(*(long *)&this->scene->field_0x8 + 0x290) == 0) {
        local_c8 = (undefined1  [16])QVar5;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          (**(code **)(*(long *)this_00 + 0x60))(__return_storage_ptr__,this_00,rect);
          return __return_storage_ptr__;
        }
      }
      else {
        local_58.w._0_4_ = 0xffffffff;
        local_58.w._4_4_ = 0xffffffff;
        local_58.h._0_4_ = 0xffffffff;
        local_58.h._4_4_ = 0xffffffff;
        local_58.xp._0_4_ = 0xffffffff;
        local_58.xp._4_4_ = 0xffffffff;
        local_58.yp._0_4_ = 0xffffffff;
        local_58.yp._4_4_ = 0xffffffff;
        QGraphicsItem::mapRectToScene(&local_58,this_01,rect);
        local_68 = (undefined1  [16])0x0;
        local_78 = (undefined1  [16])0x0;
        local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.ptr = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
        QGraphicsScene::views((QList<QGraphicsView_*> *)&local_98,(QGraphicsScene *)this->scene);
        ppQVar6 = local_98.ptr;
        lVar9 = local_98.size << 3;
        for (lVar8 = 0; lVar9 != lVar8; lVar8 = lVar8 + 8) {
          lVar1 = *(long *)((long)ppQVar6 + lVar8);
          local_b8.w._0_4_ = 0xffffffff;
          local_b8.w._4_4_ = 0xffffffff;
          local_b8.h._0_4_ = 0xffffffff;
          local_b8.h._4_4_ = 0xffffffff;
          local_b8.xp._0_4_ = 0xffffffff;
          local_b8.xp._4_4_ = 0xffffffff;
          local_b8.yp._0_4_ = 0xffffffff;
          local_b8.yp._4_4_ = 0xffffffff;
          QGraphicsViewPrivate::mapRectFromScene
                    (&local_b8,*(QGraphicsViewPrivate **)(lVar1 + 8),&local_58);
          local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          (**(code **)(*(long *)this_00 + 0x60))(&local_e8,this_00,&local_b8);
          local_c8 = QRectF::toAlignedRect();
          QGraphicsViewPrivate::mapRectToScene
                    (&local_e8,*(QGraphicsViewPrivate **)(lVar1 + 8),(QRect *)local_c8);
          QRectF::operator|=((QRectF *)local_78,&local_e8);
        }
        QGraphicsItem::mapRectFromScene(__return_storage_ptr__,this_01,(QRectF *)local_78);
        QArrayDataPointer<QGraphicsView_*>::~QArrayDataPointer(&local_98);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return __return_storage_ptr__;
        }
      }
      goto LAB_00575480;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    qVar2 = rect->xp;
    qVar3 = rect->yp;
    qVar4 = rect->h;
    __return_storage_ptr__->w = rect->w;
    __return_storage_ptr__->h = qVar4;
    __return_storage_ptr__->xp = qVar2;
    __return_storage_ptr__->yp = qVar3;
    return __return_storage_ptr__;
  }
LAB_00575480:
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsItemPrivate::effectiveBoundingRect(const QRectF &rect) const
{
#if QT_CONFIG(graphicseffect)
    Q_Q(const QGraphicsItem);
    QGraphicsEffect *effect = graphicsEffect;
    if (scene && effect && effect->isEnabled()) {
        if (scene->d_func()->views.isEmpty())
            return effect->boundingRectFor(rect);
        QRectF sceneRect = q->mapRectToScene(rect);
        QRectF sceneEffectRect;
        const auto views = scene->views();
        for (QGraphicsView *view : views) {
            QRectF deviceRect = view->d_func()->mapRectFromScene(sceneRect);
            QRect deviceEffectRect = effect->boundingRectFor(deviceRect).toAlignedRect();
            sceneEffectRect |= view->d_func()->mapRectToScene(deviceEffectRect);
        }
        return q->mapRectFromScene(sceneEffectRect);
    }
#endif // QT_CONFIG(graphicseffect)
    return rect;
}